

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

void __thiscall SchemeFilePort::~SchemeFilePort(SchemeFilePort *this)

{
  SchemeFilePort *this_local;
  
  ~SchemeFilePort(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

SchemeFilePort::~SchemeFilePort()
{
    open_files.erase(this);
}